

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

void __thiscall raspicam::_private::Private_Impl_Still::disconnectPorts(Private_Impl_Still *this)

{
  MMAL_STATUS_T MVar1;
  ostream *poVar2;
  long in_RDI;
  
  if (*(int *)(*(long *)(in_RDI + 0x10) + 0x10) != 0) {
    MVar1 = mmal_connection_disable(*(MMAL_CONNECTION_T **)(in_RDI + 0x10));
    if (MVar1 != MMAL_SUCCESS) {
      poVar2 = std::operator<<((ostream *)&std::cout,*(char **)(in_RDI + 0x78));
      std::operator<<(poVar2,": fail to disable encoder connection\n");
    }
  }
  if (*(long *)(in_RDI + 0x10) != 0) {
    MVar1 = mmal_connection_destroy(*(MMAL_CONNECTION_T **)(in_RDI + 0x10));
    if (MVar1 != MMAL_SUCCESS) {
      poVar2 = std::operator<<((ostream *)&std::cout,*(char **)(in_RDI + 0x78));
      std::operator<<(poVar2,": fail to destroy encoder connection\n");
    }
  }
  return;
}

Assistant:

void Private_Impl_Still::disconnectPorts() {
            // disable connection if enabled
            if ( encoder_connection->is_enabled && mmal_connection_disable( encoder_connection ) != MMAL_SUCCESS ) {
                cout << API_NAME << ": fail to disable encoder connection\n";
            }

            // destroy encoder connection
            // mmal_connection_disable call is mandatory before calling the destroy function otherwise it fails
            if ( encoder_connection && mmal_connection_destroy( encoder_connection ) != MMAL_SUCCESS ) {
                cout << API_NAME << ": fail to destroy encoder connection\n";
            }
        }